

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_qcd_dumpparms(jpc_ms_t *ms,FILE *out)

{
  uint uVar1;
  ulong uVar2;
  
  fprintf((FILE *)out,"qntsty = %d; numguard = %d; numstepsizes = %d\n",(ulong)(ms->parms).cod.csty,
          (ulong)(ms->parms).sot.partno,(ulong)*(uint *)((long)&ms->parms + 4));
  if (0 < *(int *)((long)&ms->parms + 4)) {
    uVar2 = 0;
    do {
      uVar1 = *(uint *)(&((ms->parms).poc.pchgs)->prgord + uVar2 * 8);
      fprintf((FILE *)out,"expn[%d] = 0x%04x; mant[%d] = 0x%04x;\n",uVar2 & 0xffffffff,
              (ulong)(uVar1 >> 0xb),uVar2 & 0xffffffff,(ulong)(uVar1 & 0x7ff));
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)*(int *)((long)&ms->parms + 4));
  }
  return 0;
}

Assistant:

static int jpc_qcd_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_qcd_t *qcd = &ms->parms.qcd;
	int i;
	fprintf(out, "qntsty = %d; numguard = %d; numstepsizes = %d\n",
	  (int) qcd->compparms.qntsty, qcd->compparms.numguard, qcd->compparms.numstepsizes);
	for (i = 0; i < qcd->compparms.numstepsizes; ++i) {
		fprintf(out, "expn[%d] = 0x%04x; mant[%d] = 0x%04x;\n",
		  i, JAS_CAST(unsigned, JPC_QCX_GETEXPN(qcd->compparms.stepsizes[i])),
		  i, JAS_CAST(unsigned, JPC_QCX_GETMANT(qcd->compparms.stepsizes[i])));
	}
	return 0;
}